

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O2

int absl::lts_20250127::(anonymous_namespace)::ConsumeDigits<10,int>
              (char *begin,char *end,int max_digits,int *out,bool *dropped_nonzero_digit)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  undefined4 in_register_00000014;
  char *original_begin;
  byte *pbVar4;
  
  iVar3 = *(int *)CONCAT44(in_register_00000014,max_digits);
  for (lVar2 = 0; ((iVar3 == 0 && (begin + lVar2 != end)) && (begin[lVar2] == '0'));
      lVar2 = lVar2 + 1) {
  }
  pbVar4 = (byte *)(begin + lVar2 + 9);
  if ((long)(end + (-lVar2 - (long)begin)) < 10) {
    pbVar4 = (byte *)end;
  }
  for (; (begin + lVar2 < pbVar4 && (bVar1 = begin[lVar2], (byte)(bVar1 - 0x30) < 10));
      lVar2 = lVar2 + 1) {
    if (SBORROW4(iVar3 * 10,iVar3) != iVar3 * 9 < 0) {
      __assert_fail("accumulator * base >= accumulator",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/charconv_parse.cc"
                    ,0x10e,
                    "int absl::lts_20250127::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 10, T = int]"
                   );
    }
    iVar3 = iVar3 * 10 + (uint)bVar1 + -0x30;
  }
  for (; (begin + lVar2 < end && ((byte)(begin[lVar2] - 0x30U) < 10)); lVar2 = lVar2 + 1) {
  }
  *(int *)CONCAT44(in_register_00000014,max_digits) = iVar3;
  return (int)lVar2;
}

Assistant:

int ConsumeDigits(const char* begin, const char* end, int max_digits, T* out,
                  bool* dropped_nonzero_digit) {
  if (base == 10) {
    assert(max_digits <= std::numeric_limits<T>::digits10);
  } else if (base == 16) {
    assert(max_digits * 4 <= std::numeric_limits<T>::digits);
  }
  const char* const original_begin = begin;

  // Skip leading zeros, but only if *out is zero.
  // They don't cause an overflow so we don't have to count them for
  // `max_digits`.
  while (!*out && end != begin && *begin == '0') ++begin;

  T accumulator = *out;
  const char* significant_digits_end =
      (end - begin > max_digits) ? begin + max_digits : end;
  while (begin < significant_digits_end && IsDigit<base>(*begin)) {
    // Do not guard against *out overflow; max_digits was chosen to avoid this.
    // Do assert against it, to detect problems in debug builds.
    auto digit = static_cast<T>(ToDigit<base>(*begin));
    assert(accumulator * base >= accumulator);
    accumulator *= base;
    assert(accumulator + digit >= accumulator);
    accumulator += digit;
    ++begin;
  }
  bool dropped_nonzero = false;
  while (begin < end && IsDigit<base>(*begin)) {
    dropped_nonzero = dropped_nonzero || (*begin != '0');
    ++begin;
  }
  if (dropped_nonzero && dropped_nonzero_digit != nullptr) {
    *dropped_nonzero_digit = true;
  }
  *out = accumulator;
  return static_cast<int>(begin - original_begin);
}